

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_BuildingInfo.h
# Opt level: O0

void __thiscall RenX::BuildingInfo::BuildingInfo(BuildingInfo *this)

{
  BuildingInfo *this_local;
  
  std::__cxx11::string::string((string *)this);
  this->team = Other;
  this->health = 0;
  this->max_health = 0;
  this->armor = 0;
  this->max_armor = 0;
  this->capturable = false;
  this->destroyed = false;
  std::chrono::
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  ::time_point(&this->destruction_time);
  Jupiter::Config::Config(&this->varData);
  return;
}

Assistant:

struct RENX_API BuildingInfo
	{
		std::string name;
		TeamType team = TeamType::Other;
		int health = 0;
		int max_health = 0;
		int armor = 0;
		int max_armor = 0;
		bool capturable = false;
		bool destroyed = false;
		std::chrono::steady_clock::time_point destruction_time;
		mutable Jupiter::Config varData;
	}